

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O2

void __thiscall QToolBox::QToolBox(QToolBox *this,QWidget *parent,WindowFlags f)

{
  long lVar1;
  QToolBoxPrivate *this_00;
  QLayout *this_01;
  long in_FS_OFFSET;
  QMargins local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QToolBoxPrivate *)operator_new(0x2a0);
  QToolBoxPrivate::QToolBoxPrivate(this_00);
  QFrame::QFrame(&this->super_QFrame,(QFramePrivate *)this_00,parent,f);
  *(undefined ***)&(this->super_QFrame).super_QWidget = &PTR_metaObject_007d8450;
  *(undefined ***)&(this->super_QFrame).super_QWidget.super_QPaintDevice = &PTR__QToolBox_007d8618;
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  this_01 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_01,(QWidget *)this);
  *(QLayout **)(lVar1 + 0x290) = this_01;
  local_38.m_left.m_i = 0;
  local_38.m_top.m_i = 0;
  local_38.m_right.m_i = 0;
  local_38.m_bottom.m_i = 0;
  QLayout::setContentsMargins(this_01,&local_38);
  QWidget::setBackgroundRole((QWidget *)this,Button);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QToolBox::QToolBox(QWidget *parent, Qt::WindowFlags f)
    :  QFrame(*new QToolBoxPrivate, parent, f)
{
    Q_D(QToolBox);
    d->layout = new QVBoxLayout(this);
    d->layout->setContentsMargins(QMargins());
    setBackgroundRole(QPalette::Button);
}